

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_definition.c
# Opt level: O2

void prf_instance_definition_entry_f(prf_node_t *node,prf_state_t *state)

{
  uint uVar1;
  prf_node_t **pppVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (node->opcode != prf_instance_definition_info.opcode) {
    prf_error(9,"instance definition entry state method tried on node of type %d.");
    return;
  }
  uVar1 = prf_array_count(state->instances);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
LAB_001072c8:
      if ((uint)uVar3 == uVar1) {
        pppVar2 = (prf_node_t **)prf_array_append_ptr(state->instances,node);
        state->instances = pppVar2;
      }
      return;
    }
    if (state->instances[uVar4] == node) {
      uVar3 = uVar4 & 0xffffffff;
      goto LAB_001072c8;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static void
prf_instance_definition_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    int i, n;
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_instance_definition_info.opcode ) {
        prf_error( 9, "instance definition entry state method tried "
                   "on node of type %d.", node->opcode );
        return;
    }
    n = prf_array_count( state->instances );
    for ( i = 0; i < n; i++ )
        if (state->instances[i] == node) break;
    if ( i == n )
        state->instances =
           (prf_node_t **) prf_array_append_ptr( state->instances, node );
}